

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O3

void __thiscall
amrex::BaseFab<char>::setVal<(amrex::RunOn)1>
          (BaseFab<char> *this,char *x,Box *bx,DestComp dcomp,NumComps ncomp)

{
  Box *pBVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  anon_class_72_3_b144924a local_78;
  
  local_78.a.p = this->dptr;
  local_78.a.ncomp = this->nvar;
  pBVar1 = &this->domain;
  local_78.a.begin.z = (this->domain).smallend.vect[2];
  local_78.a.begin.x = (pBVar1->smallend).vect[0];
  local_78.a.begin.y = (pBVar1->smallend).vect[1];
  lVar3 = (long)(this->domain).bigend.vect[1] + 1;
  iVar2 = (this->domain).bigend.vect[0];
  lVar4 = (long)(this->domain).bigend.vect[2] + 1;
  local_78.a.jstride = ((long)iVar2 - (long)(pBVar1->smallend).vect[0]) + 1;
  local_78.a.kstride = (lVar3 - (this->domain).smallend.vect[1]) * local_78.a.jstride;
  local_78.a.nstride = (lVar4 - local_78.a.begin.z) * local_78.a.kstride;
  local_78.a.end._0_8_ = (ulong)(iVar2 + 1) | lVar3 << 0x20;
  local_78.a.end.z = (int)lVar4;
  local_78.x = *x;
  local_78.dcomp.i = dcomp.i;
  LoopConcurrentOnCpu<amrex::BaseFab<char>::setVal<(amrex::RunOn)1>(char_const&,amrex::Box_const&,amrex::DestComp,amrex::NumComps)::_lambda(int,int,int,int)_1_>
            (bx,ncomp.n,&local_78);
  return;
}

Assistant:

void
BaseFab<T>::setVal (T const& x, Box const& bx, DestComp dcomp, NumComps ncomp) noexcept
{
    AMREX_ASSERT(dcomp.i >= 0 && dcomp.i + ncomp.n <= this->nvar);
    Array4<T> const& a = this->array();
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG (run_on, bx, ncomp.n, i, j, k, n,
    {
        a(i,j,k,n+dcomp.i) = x;
    });
}